

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O1

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  
  uVar3 = 0xffffff9c;
  if (len >> 0x20 == 0) {
    uVar4 = 1;
    if (0x7f < len) {
      uVar4 = 1;
      sVar5 = len;
      do {
        uVar4 = uVar4 + 1;
        bVar2 = 0xff < sVar5;
        sVar5 = sVar5 >> 8;
      } while (bVar2);
    }
    uVar3 = 0xffffff94;
    if ((long)(ulong)uVar4 <= (long)*p - (long)start) {
      do {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (uchar)len;
        bVar2 = 0xff < len;
        len = len >> 8;
      } while (bVar2);
      uVar3 = uVar4;
      if (1 < uVar4) {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (char)uVar4 + '\x7f';
      }
    }
  }
  return uVar3;
}

Assistant:

int mbedtls_asn1_write_len(unsigned char **p, const unsigned char *start, size_t len)
{
#if SIZE_MAX > 0xFFFFFFFF
    if (len > 0xFFFFFFFF) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
#endif

    int required = 1;

    if (len >= 0x80) {
        for (size_t l = len; l != 0; l >>= 8) {
            required++;
        }
    }

    if (required > (*p - start)) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    do {
        *--(*p) = MBEDTLS_BYTE_0(len);
        len >>= 8;
    } while (len);

    if (required > 1) {
        *--(*p) = (unsigned char) (0x80 + required - 1);
    }

    return required;
}